

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

Regexp * __thiscall
re2::CoalesceWalker::PostVisit
          (CoalesceWalker *this,Regexp *re,Regexp *parent_arg,Regexp *pre_arg,Regexp **child_args,
          int nchild_args)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  RegexpOp RVar4;
  ParseFlags PVar5;
  Regexp **ppRVar6;
  int local_a8;
  int local_a4;
  int j;
  int i_5;
  Regexp **nre_subs;
  Regexp *nre;
  int i_4;
  int n;
  int i_3;
  int i_2;
  Regexp **nre_subs_2;
  Regexp *nre_2;
  int i_1;
  bool can_coalesce;
  int i;
  Regexp **nre_subs_1;
  Regexp *nre_1;
  int nchild_args_local;
  Regexp **child_args_local;
  Regexp *pre_arg_local;
  Regexp *parent_arg_local;
  Regexp *re_local;
  CoalesceWalker *this_local;
  
  iVar3 = Regexp::nsub(re);
  if (iVar3 == 0) {
    this_local = (CoalesceWalker *)Regexp::Incref(re);
  }
  else {
    RVar4 = Regexp::op(re);
    if (RVar4 == kRegexpConcat) {
      bVar1 = false;
      for (nre_2._4_4_ = 0; iVar3 = Regexp::nsub(re), nre_2._4_4_ < iVar3;
          nre_2._4_4_ = nre_2._4_4_ + 1) {
        iVar3 = Regexp::nsub(re);
        if ((nre_2._4_4_ + 1 < iVar3) &&
           (bVar2 = CanCoalesce(child_args[nre_2._4_4_],child_args[nre_2._4_4_ + 1]), bVar2)) {
          bVar1 = true;
          break;
        }
      }
      if (bVar1) {
        for (i_4 = 0; iVar3 = Regexp::nsub(re), i_4 < iVar3; i_4 = i_4 + 1) {
          iVar3 = Regexp::nsub(re);
          if ((i_4 + 1 < iVar3) && (bVar1 = CanCoalesce(child_args[i_4],child_args[i_4 + 1]), bVar1)
             ) {
            DoCoalesce(child_args + i_4,child_args + (i_4 + 1));
          }
        }
        nre._4_4_ = 0;
        for (nre._0_4_ = 0; iVar3 = Regexp::nsub(re), (int)nre < iVar3; nre._0_4_ = (int)nre + 1) {
          RVar4 = Regexp::op(child_args[(int)nre]);
          if (RVar4 == kRegexpEmptyMatch) {
            nre._4_4_ = nre._4_4_ + 1;
          }
        }
        this_local = (CoalesceWalker *)operator_new(0x28);
        RVar4 = Regexp::op(re);
        PVar5 = Regexp::parse_flags(re);
        Regexp::Regexp((Regexp *)this_local,RVar4,PVar5);
        iVar3 = Regexp::nsub(re);
        Regexp::AllocSub((Regexp *)this_local,iVar3 - nre._4_4_);
        ppRVar6 = Regexp::sub((Regexp *)this_local);
        local_a8 = 0;
        for (local_a4 = 0; iVar3 = Regexp::nsub(re), local_a4 < iVar3; local_a4 = local_a4 + 1) {
          RVar4 = Regexp::op(child_args[local_a4]);
          if (RVar4 == kRegexpEmptyMatch) {
            Regexp::Decref(child_args[local_a4]);
          }
          else {
            ppRVar6[local_a8] = child_args[local_a4];
            local_a8 = local_a8 + 1;
          }
        }
      }
      else {
        bVar1 = ChildArgsChanged(re,child_args);
        if (bVar1) {
          this_local = (CoalesceWalker *)operator_new(0x28);
          RVar4 = Regexp::op(re);
          PVar5 = Regexp::parse_flags(re);
          Regexp::Regexp((Regexp *)this_local,RVar4,PVar5);
          iVar3 = Regexp::nsub(re);
          Regexp::AllocSub((Regexp *)this_local,iVar3);
          ppRVar6 = Regexp::sub((Regexp *)this_local);
          for (n = 0; iVar3 = Regexp::nsub(re), n < iVar3; n = n + 1) {
            ppRVar6[n] = child_args[n];
          }
        }
        else {
          this_local = (CoalesceWalker *)Regexp::Incref(re);
        }
      }
    }
    else {
      bVar1 = ChildArgsChanged(re,child_args);
      if (bVar1) {
        this_local = (CoalesceWalker *)operator_new(0x28);
        RVar4 = Regexp::op(re);
        PVar5 = Regexp::parse_flags(re);
        Regexp::Regexp((Regexp *)this_local,RVar4,PVar5);
        iVar3 = Regexp::nsub(re);
        Regexp::AllocSub((Regexp *)this_local,iVar3);
        ppRVar6 = Regexp::sub((Regexp *)this_local);
        for (i_1 = 0; iVar3 = Regexp::nsub(re), i_1 < iVar3; i_1 = i_1 + 1) {
          ppRVar6[i_1] = child_args[i_1];
        }
        RVar4 = Regexp::op(re);
        if (RVar4 == kRegexpRepeat) {
          iVar3 = Regexp::min(re);
          (((Regexp *)this_local)->field_7).field_0.min_ = iVar3;
          iVar3 = Regexp::max(re);
          (((Regexp *)this_local)->field_7).field_0.max_ = iVar3;
        }
        else {
          RVar4 = Regexp::op(re);
          if (RVar4 == kRegexpCapture) {
            iVar3 = Regexp::cap(re);
            (((Regexp *)this_local)->field_7).field_0.max_ = iVar3;
          }
        }
      }
      else {
        this_local = (CoalesceWalker *)Regexp::Incref(re);
      }
    }
  }
  return (Regexp *)this_local;
}

Assistant:

Regexp* CoalesceWalker::PostVisit(Regexp* re,
                                  Regexp* parent_arg,
                                  Regexp* pre_arg,
                                  Regexp** child_args,
                                  int nchild_args) {
  if (re->nsub() == 0)
    return re->Incref();

  if (re->op() != kRegexpConcat) {
    if (!ChildArgsChanged(re, child_args))
      return re->Incref();

    // Something changed. Build a new op.
    Regexp* nre = new Regexp(re->op(), re->parse_flags());
    nre->AllocSub(re->nsub());
    Regexp** nre_subs = nre->sub();
    for (int i = 0; i < re->nsub(); i++)
      nre_subs[i] = child_args[i];
    // Repeats and Captures have additional data that must be copied.
    if (re->op() == kRegexpRepeat) {
      nre->min_ = re->min();
      nre->max_ = re->max();
    } else if (re->op() == kRegexpCapture) {
      nre->cap_ = re->cap();
    }
    return nre;
  }

  bool can_coalesce = false;
  for (int i = 0; i < re->nsub(); i++) {
    if (i+1 < re->nsub() &&
        CanCoalesce(child_args[i], child_args[i+1])) {
      can_coalesce = true;
      break;
    }
  }
  if (!can_coalesce) {
    if (!ChildArgsChanged(re, child_args))
      return re->Incref();

    // Something changed. Build a new op.
    Regexp* nre = new Regexp(re->op(), re->parse_flags());
    nre->AllocSub(re->nsub());
    Regexp** nre_subs = nre->sub();
    for (int i = 0; i < re->nsub(); i++)
      nre_subs[i] = child_args[i];
    return nre;
  }

  for (int i = 0; i < re->nsub(); i++) {
    if (i+1 < re->nsub() &&
        CanCoalesce(child_args[i], child_args[i+1]))
      DoCoalesce(&child_args[i], &child_args[i+1]);
  }
  // Determine how many empty matches were left by DoCoalesce.
  int n = 0;
  for (int i = n; i < re->nsub(); i++) {
    if (child_args[i]->op() == kRegexpEmptyMatch)
      n++;
  }
  // Build a new op.
  Regexp* nre = new Regexp(re->op(), re->parse_flags());
  nre->AllocSub(re->nsub() - n);
  Regexp** nre_subs = nre->sub();
  for (int i = 0, j = 0; i < re->nsub(); i++) {
    if (child_args[i]->op() == kRegexpEmptyMatch) {
      child_args[i]->Decref();
      continue;
    }
    nre_subs[j] = child_args[i];
    j++;
  }
  return nre;
}